

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileForeach(jx9_gen_state *pGen)

{
  SyToken *pSVar1;
  jx9_vm *pjVar2;
  SyToken *pSVar3;
  SyToken *pSVar4;
  sxi32 sVar5;
  sxi32 sVar6;
  sxu32 sVar7;
  SyToken *pSVar8;
  undefined8 *pSrc;
  VmInstr *pVVar9;
  char *pcVar10;
  GenBlock **ppBlock;
  SyToken *pSVar11;
  GenBlock *pForeachBlock;
  SyToken *local_50;
  SyToken *local_48;
  SyToken *pEnd;
  sxu32 nFalseJump;
  
  pEnd = (SyToken *)0x0;
  pForeachBlock = (GenBlock *)0x0;
  pSVar8 = pGen->pIn;
  sVar7 = pSVar8->nLine;
  pGen->pIn = pSVar8 + 1;
  if ((pSVar8 + 1 < pGen->pEnd) && ((pSVar8[1].nType & 0x200) != 0)) {
    pGen->pIn = pSVar8 + 2;
    sVar6 = GenStateEnterBlock(pGen,1,pGen->pVm->pByteContainer->nUsed,(void *)0x0,&pForeachBlock);
    if (sVar6 != 0) {
      return -10;
    }
    jx9DelimitNestedTokens(pGen->pIn,pGen->pEnd,0x200,0x400,&pEnd);
    pSVar4 = pEnd;
    pSVar8 = pGen->pIn;
    if ((pSVar8 == pEnd) || (pSVar1 = pGen->pEnd, pSVar11 = pSVar8, pSVar1 <= pEnd)) {
      sVar6 = jx9GenCompileError(pGen,1,sVar7,"foreach: Missing expression");
      if (sVar6 != -10) {
        pGen->pIn = pSVar4;
        if (pSVar4 < pGen->pEnd) {
          pGen->pIn = pSVar4 + 1;
        }
        return 0;
      }
      return -10;
    }
    do {
      pSVar3 = pSVar11;
      pSVar11 = pSVar3 + 1;
      if (pEnd <= pSVar3) break;
    } while (((pSVar3->nType & 4) == 0) || (*(int *)&pSVar3->pUserData != 0xb));
    if (pSVar8 < pSVar3) {
      pGen->pEnd = pSVar3;
      sVar6 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
      if (sVar6 == -10) {
        return -10;
      }
      local_48 = pSVar3 + 2;
      pSVar8 = pGen->pIn;
      local_50 = pSVar1;
      while (pSVar8 < pSVar3) {
        sVar6 = jx9GenCompileError(pGen,1,pSVar8->nLine,"foreach: Unexpected token \'%z\'");
        if (sVar6 == -10) {
          return -10;
        }
        pSVar8 = pGen->pIn + 1;
        pGen->pIn = pSVar8;
      }
      pGen->pIn = pSVar11;
      if ((pSVar4 <= pSVar11) &&
         (sVar6 = jx9GenCompileError(pGen,1,pSVar3[1].nLine,"foreach: Missing $key => $value pair"),
         sVar6 == -10)) {
        return -10;
      }
      pSrc = (undefined8 *)SyMemBackendAlloc(&pGen->pVm->sAllocator,0x50);
      if (pSrc == (undefined8 *)0x0) {
        jx9GenCompileError(pGen,1,pGen->pIn->nLine,"Fatal, JX9 engine is running out-of-memory");
        return -10;
      }
      SyZero(pSrc,0x50);
      pjVar2 = pGen->pVm;
      *(undefined4 *)(pSrc + 7) = 0;
      *(undefined4 *)((long)pSrc + 0x3c) = 0;
      *(undefined4 *)(pSrc + 8) = 8;
      *(undefined4 *)((long)pSrc + 0x44) = 0;
      pSrc[5] = pjVar2;
      pSrc[6] = 0;
      pSrc[9] = 0;
      for (pSVar8 = local_48; pSVar1 = pSVar8 + -1, pSVar1 < pSVar4; pSVar8 = pSVar8 + 1) {
        if ((pSVar8[-1].nType & 0x20000) != 0) {
          if (pGen->pIn < pSVar1) {
            pGen->pEnd = pSVar1;
            sVar6 = jx9CompileExpr(pGen,0,GenStateForEachNodeValidator);
            if (sVar6 == -10) {
              return -10;
            }
            pVVar9 = jx9VmPopInstr(pGen->pVm);
            pcVar10 = (char *)pVVar9->p3;
            if (pcVar10 != (char *)0x0) {
              *pSrc = pcVar10;
              sVar7 = SyStrlen(pcVar10);
              *(sxu32 *)(pSrc + 1) = sVar7;
            }
            *(byte *)(pSrc + 4) = *(byte *)(pSrc + 4) | 1;
          }
          else {
            sVar6 = jx9GenCompileError(pGen,1,pGen->pIn->nLine,"foreach: Missing $key");
            if (sVar6 == -10) {
              return -10;
            }
          }
          pGen->pIn = pSVar8;
          goto LAB_00123273;
        }
      }
      pSVar8 = pGen->pIn;
LAB_00123273:
      pGen->pEnd = pSVar4;
      if (pSVar8 < pSVar4) {
        sVar6 = jx9CompileExpr(pGen,0,GenStateForEachNodeValidator);
        if (sVar6 == -10) {
          return -10;
        }
        pVVar9 = jx9VmPopInstr(pGen->pVm);
        pcVar10 = (char *)pVVar9->p3;
        if (pcVar10 != (char *)0x0) {
          pSrc[2] = pcVar10;
          sVar7 = SyStrlen(pcVar10);
          *(sxu32 *)(pSrc + 3) = sVar7;
        }
        jx9VmEmitInstr(pGen->pVm,0x43,0,0,pSrc,&nFalseJump);
        GenStateNewJumpFixup(pForeachBlock,0x43,nFalseJump);
        pjVar2 = pGen->pVm;
        pForeachBlock->nFirstInstr = pjVar2->pByteContainer->nUsed;
        jx9VmEmitInstr(pjVar2,0x44,0,0,pSrc,&nFalseJump);
        GenStateNewJumpFixup(pForeachBlock,0x44,nFalseJump);
        pGen->pIn = pSVar4 + 1;
        pGen->pEnd = local_50;
        sVar6 = jx9CompileBlock(pGen);
        if (sVar6 != -10) {
          jx9VmEmitInstr(pGen->pVm,8,0,pForeachBlock->nFirstInstr,(void *)0x0,(sxu32 *)0x0);
          ppBlock = (GenBlock **)0xffffffffffffffff;
          GenStateFixJumps(pForeachBlock,-1,pGen->pVm->pByteContainer->nUsed);
          GenStateLeaveBlock(pGen,ppBlock);
          return 0;
        }
        return -10;
      }
      sVar7 = pSVar8->nLine;
      pcVar10 = "foreach: Missing $value";
    }
    else {
      sVar7 = pSVar8->nLine;
      pcVar10 = "foreach: Missing array/object expression";
    }
  }
  else {
    pcVar10 = "foreach: Expected \'(\'";
  }
  sVar5 = jx9GenCompileError(pGen,1,sVar7,pcVar10);
  sVar6 = -10;
  if (sVar5 != -10) {
    pSVar8 = pGen->pIn;
    while ((sVar6 = 0, pSVar8 < pGen->pEnd && (sVar6 = 0, (pSVar8->nType & 0x40040) == 0))) {
      pSVar8 = pSVar8 + 1;
      pGen->pIn = pSVar8;
    }
  }
  return sVar6;
}

Assistant:

static sxi32 jx9CompileForeach(jx9_gen_state *pGen)
{ 
	SyToken *pCur, *pTmp, *pEnd = 0;
	GenBlock *pForeachBlock = 0;
	jx9_foreach_info *pInfo;
	sxu32 nFalseJump;
	VmInstr *pInstr;
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	/* Jump the 'foreach' keyword */
	pGen->pIn++;    
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "foreach: Expected '('");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Jump the left parenthesis '(' */
	pGen->pIn++; 
	/* Create the loop block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_LOOP, jx9VmInstrLength(pGen->pVm), 0, &pForeachBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Delimit the expression */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pGen->pIn == pEnd || pEnd >= pGen->pEnd ){
		/* Empty expression */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "foreach: Missing expression");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		/* Synchronize */
		pGen->pIn = pEnd;
		if( pGen->pIn < pGen->pEnd ){
			pGen->pIn++;
		}
		return SXRET_OK;
	}
	/* Compile the array expression */
	pCur = pGen->pIn;
	while( pCur < pEnd ){
		if( pCur->nType & JX9_TK_KEYWORD ){
			sxi32 nKeywrd = SX_PTR_TO_INT(pCur->pUserData);
			if( nKeywrd == JX9_TKWRD_AS ){
				/* Break with the first 'as' found */
				break;
			}
		}
		/* Advance the stream cursor */
		pCur++;
	}
	if( pCur <= pGen->pIn ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, 
			"foreach: Missing array/object expression");
		if( rc == SXERR_ABORT ){
			/* Don't worry about freeing memory, everything will be released shortly */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Swap token streams */
	pTmp = pGen->pEnd;
	pGen->pEnd = pCur;
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}
	/* Update token stream */
	while(pGen->pIn < pCur ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "foreach: Unexpected token '%z'", &pGen->pIn->sData);
		if( rc == SXERR_ABORT ){
			/* Don't worry about freeing memory, everything will be released shortly */
			return SXERR_ABORT;
		}
		pGen->pIn++;
	}
	pCur++; /* Jump the 'as' keyword */
	pGen->pIn = pCur; 
	if( pGen->pIn >= pEnd ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "foreach: Missing $key => $value pair");
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
	}
	/* Create the foreach context */
	pInfo = (jx9_foreach_info *)SyMemBackendAlloc(&pGen->pVm->sAllocator, sizeof(jx9_foreach_info));
	if( pInfo == 0 ){
		jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Fatal, JX9 engine is running out-of-memory");
		return SXERR_ABORT;
	}
	/* Zero the structure */
	SyZero(pInfo, sizeof(jx9_foreach_info));
	/* Initialize structure fields */
	SySetInit(&pInfo->aStep, &pGen->pVm->sAllocator, sizeof(jx9_foreach_step *));
	/* Check if we have a key field */
	while( pCur < pEnd && (pCur->nType & JX9_TK_COMMA) == 0 ){
		pCur++;
	}
	if( pCur < pEnd ){
		/* Compile the expression holding the key name */
		if( pGen->pIn >= pCur ){
			rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "foreach: Missing $key");
			if( rc == SXERR_ABORT ){
				/* Don't worry about freeing memory, everything will be released shortly */
				return SXERR_ABORT;
			}
		}else{
			pGen->pEnd = pCur;
			rc = jx9CompileExpr(&(*pGen), 0, GenStateForEachNodeValidator);
			if( rc == SXERR_ABORT ){
				/* Don't worry about freeing memory, everything will be released shortly */
				return SXERR_ABORT;
			}
			pInstr = jx9VmPopInstr(pGen->pVm);
			if( pInstr->p3 ){
				/* Record key name */
				SyStringInitFromBuf(&pInfo->sKey, pInstr->p3, SyStrlen((const char *)pInstr->p3));
			}
			pInfo->iFlags |= JX9_4EACH_STEP_KEY;
		}
		pGen->pIn = &pCur[1]; /* Jump the arrow */
	}
	pGen->pEnd = pEnd;
	if( pGen->pIn >= pEnd ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "foreach: Missing $value");
		if( rc == SXERR_ABORT ){
			/* Don't worry about freeing memory, everything will be released shortly */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Compile the expression holding the value name */
	rc = jx9CompileExpr(&(*pGen), 0, GenStateForEachNodeValidator);
	if( rc == SXERR_ABORT ){
		/* Don't worry about freeing memory, everything will be released shortly */
		return SXERR_ABORT;
	}
	pInstr = jx9VmPopInstr(pGen->pVm);
	if( pInstr->p3 ){
		/* Record value name */
		SyStringInitFromBuf(&pInfo->sValue, pInstr->p3, SyStrlen((const char *)pInstr->p3));
	}
	/* Emit the 'FOREACH_INIT' instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_FOREACH_INIT, 0, 0, pInfo, &nFalseJump);
	/* Save the instruction index so we can fix it later when the jump destination is resolved */
	GenStateNewJumpFixup(pForeachBlock, JX9_OP_FOREACH_INIT, nFalseJump);
	/* Record the first instruction to execute */
	pForeachBlock->nFirstInstr = jx9VmInstrLength(pGen->pVm);
	/* Emit the FOREACH_STEP instruction */
    jx9VmEmitInstr(pGen->pVm, JX9_OP_FOREACH_STEP, 0, 0, pInfo, &nFalseJump);
	/* Save the instruction index so we can fix it later when the jump destination is resolved */
	GenStateNewJumpFixup(pForeachBlock, JX9_OP_FOREACH_STEP, nFalseJump);
	/* Compile the loop body */
	pGen->pIn = &pEnd[1];
	pGen->pEnd = pTmp;
	rc = jx9CompileBlock(&(*pGen));
	if( rc == SXERR_ABORT ){
		/* Don't worry about freeing memory, everything will be released shortly */
		return SXERR_ABORT;
	}
	/* Emit the unconditional jump to the start of the loop */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, pForeachBlock->nFirstInstr, 0, 0);
	/* Fix all jumps now the destination is resolved */
	GenStateFixJumps(pForeachBlock, -1,jx9VmInstrLength(pGen->pVm));
	/* Release the loop block */
	GenStateLeaveBlock(pGen, 0);
	/* Statement successfully compiled */
	return SXRET_OK;
Synchronize:
	/* Synchronize with the first semi-colon ';' so we can avoid 
	 * compiling this erroneous block.
	 */
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI|JX9_TK_OCB)) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}